

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderMaxPatchVertices::initTransformFeedbackBufferObjects
          (TessellationShaderMaxPatchVertices *this)

{
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  undefined4 extraout_var;
  long lVar4;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo_id_f_1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1e5);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo_id_f_2);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1e8);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo_id_i_1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1eb);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo_id_i_2);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1ee);
  (**(code **)(lVar4 + 0xd0))(0x8e22,this->m_tf_id_1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindTransformFeedback() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1f2);
  (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_bo_id_f_1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1f5);
  (**(code **)(lVar4 + 0x150))(0x8c8e,0x20,0,0x88e4);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBufferData() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1fa);
  (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_bo_id_i_1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1fd);
  (**(code **)(lVar4 + 0x150))(0x8c8e,0x20,0,0x88e4);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBufferData() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x202);
  (**(code **)(lVar4 + 0x40))(0x8c8e,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindTransformFeedback(0) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x205);
  uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar3 & 0x300) != 0) {
    (**(code **)(lVar4 + 0xd0))(0x8e22,this->m_tf_id_2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindTransformFeedback() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x20b);
    (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_bo_id_f_2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindBuffer() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x20e);
    (**(code **)(lVar4 + 0x150))(0x8c8e,0x20,0,0x88e4);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBufferData() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x213);
    (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_bo_id_i_2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindBuffer() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x216);
    (**(code **)(lVar4 + 0x150))(0x8c8e,0x20,0,0x88e4);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBufferData() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x21b);
    (**(code **)(lVar4 + 0x40))(0x8c8e,0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindTransformFeedback(0) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x21e);
    (**(code **)(lVar4 + 0x14c8))(this->m_po_id_2,2,m_tf_varyings,0x8c8d);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glTransformFeedbackVaryings() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x221);
    return;
  }
  return;
}

Assistant:

void TessellationShaderMaxPatchVertices::initTransformFeedbackBufferObjects(void)
{
	/* Retrieve ES entry/state points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Creating Transform Feedback buffer objects. */
	gl.genBuffers(1, &m_bo_id_f_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	gl.genBuffers(1, &m_bo_id_f_2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	gl.genBuffers(1, &m_bo_id_i_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	gl.genBuffers(1, &m_bo_id_i_2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	/* Transform feedback buffers for case 1*/
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_tf_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback() failed!");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_f_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER,
				  ((sizeof(glw::GLfloat)) * 4 /* components */ * OUTPUT_VERTEX_COUNT /* vertices */), DE_NULL,
				  GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_i_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER,
				  ((sizeof(glw::GLint)) * 4 /* components */ * OUTPUT_VERTEX_COUNT /* vertices */), DE_NULL,
				  GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback(0) failed");

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Transform feedback buffers for case 2*/
		gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_tf_id_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback() failed!");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_f_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER,
					  ((sizeof(glw::GLfloat)) * 4 /* components */ * OUTPUT_VERTEX_COUNT /* vertices */), DE_NULL,
					  GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_i_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER,
					  ((sizeof(glw::GLint)) * 4 /* components */ * OUTPUT_VERTEX_COUNT /* vertices */), DE_NULL,
					  GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback(0) failed");

		gl.transformFeedbackVaryings(m_po_id_2, 2 /* count */, m_tf_varyings, GL_SEPARATE_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed!");
	}
}